

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::num_suffix(spec *s)

{
  either *in_RDI;
  anon_class_8_1_54a39813 graph;
  anon_class_8_1_54a39813 non_digit_graph;
  char_type c;
  either *this;
  either *in_stack_ffffffffffffff00;
  sequence *in_stack_ffffffffffffff08;
  either *in_stack_ffffffffffffff10;
  character *in_stack_ffffffffffffff18;
  sequence *in_stack_ffffffffffffff20;
  anon_class_8_1_54a39813 *in_stack_ffffffffffffff68;
  anon_class_8_1_54a39813 *in_stack_ffffffffffffff88;
  
  this = in_RDI;
  character::character((character *)in_RDI,(char_type)((ulong)in_RDI >> 0x38));
  c = (char_type)((ulong)in_RDI >> 0x38);
  num_suffix::anon_class_8_1_54a39813::operator()(in_stack_ffffffffffffff68);
  character::character((character *)this,c);
  num_suffix::anon_class_8_1_54a39813::operator()(in_stack_ffffffffffffff88);
  sequence::sequence<toml::detail::character,toml::detail::either>
            ((sequence *)in_stack_ffffffffffffff10,(character *)in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
  num_suffix::anon_class_8_1_54a39813::operator()(in_stack_ffffffffffffff88);
  either::either<toml::detail::sequence,toml::detail::either>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
  sequence::sequence<toml::detail::character,toml::detail::either,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (repeat_at_least *)in_stack_ffffffffffffff08);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either(this);
  either::~either(this);
  sequence::~sequence((sequence *)this);
  either::~either(this);
  character::~character((character *)0x697832);
  either::~either(this);
  character::~character((character *)0x69784c);
  return (sequence *)this;
}

Assistant:

TOML11_INLINE sequence num_suffix(const spec& s)
{
    const auto non_digit_graph = [&s]() {
        return either(
            alpha(s),
            non_ascii(s)
        );
    };
    const auto graph = [&s]() {
        return either(
            alpha(s),
            digit(s),
            non_ascii(s)
        );
    };

    return sequence(
            character(char_type('_')),
            non_digit_graph(),
            repeat_at_least(0,
                either(
                    sequence(character(char_type('_')), graph()),
                    graph()
                )
            )
        );
}